

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ** __thiscall ImGuiStorage::GetVoidPtrRef(ImGuiStorage *this,ImGuiID key,void *default_val)

{
  ImGuiStoragePair *pIVar1;
  ImGuiStoragePair *it;
  ulong uVar2;
  ulong uVar3;
  ulong uVar5;
  ImGuiStoragePair local_10;
  ulong uVar4;
  
  uVar2 = (ulong)(this->Data).Size;
  pIVar1 = (this->Data).Data;
  it = pIVar1;
  uVar4 = uVar2;
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    do {
      uVar3 = uVar4 >> 1;
      uVar5 = uVar3;
      if (it[uVar3].key < key) {
        uVar5 = ~uVar3 + uVar4;
        it = it + uVar3 + 1;
      }
      uVar4 = uVar5;
    } while (uVar5 != 0);
  }
  if ((it == pIVar1 + uVar2) || (it->key != key)) {
    local_10.key = key;
    local_10.field_1.val_p = default_val;
    it = ImVector<ImGuiStorage::ImGuiStoragePair>::insert(&this->Data,it,&local_10);
  }
  return (void **)&it->field_1;
}

Assistant:

void** ImGuiStorage::GetVoidPtrRef(ImGuiID key, void* default_val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, ImGuiStoragePair(key, default_val));
    return &it->val_p;
}